

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_cat.cpp
# Opt level: O3

int main(void)

{
  FILE *__stream;
  FILE *input;
  uint uVar1;
  int iVar2;
  uchar *data;
  
  data = (uchar *)operator_new__(10000);
  iVar2 = 0;
  memset(data + 2,0,0x270e);
  input = _stdin;
  __stream = _stdout;
  uVar1 = getc(_stdin);
  data[1] = (uchar)uVar1;
  *data = '\0';
  if ((uchar)uVar1 != '\t') {
    fputc(uVar1 & 0xff,__stream);
    *data = *data + '\t';
    iVar2 = libbrain::
            state<41U,_(libbrain::bfop)2,_(libbrain::bfop)6,_(libbrain::bfop)0,_(libbrain::bfop)0,_(libbrain::bfop)0,_(libbrain::bfop)0,_(libbrain::bfop)0,_(libbrain::bfop)0,_(libbrain::bfop)0,_(libbrain::bfop)0,_(libbrain::bfop)0,_(libbrain::bfop)2,_(libbrain::bfop)5,_(libbrain::bfop)3,_(libbrain::bfop)7,_(libbrain::bfop)1,_(libbrain::bfop)2,_(libbrain::bfop)1,_(libbrain::bfop)3,_(libbrain::bfop)8,_(libbrain::bfop)2,_(libbrain::bfop)7,_(libbrain::bfop)0,_(libbrain::bfop)0,_(libbrain::bfop)0,_(libbrain::bfop)0,_(libbrain::bfop)0,_(libbrain::bfop)0,_(libbrain::bfop)0,_(libbrain::bfop)0,_(libbrain::bfop)0,_(libbrain::bfop)4,_(libbrain::bfop)3,_(libbrain::bfop)0,_(libbrain::bfop)0,_(libbrain::bfop)0,_(libbrain::bfop)0,_(libbrain::bfop)0,_(libbrain::bfop)0,_(libbrain::bfop)0,_(libbrain::bfop)0,_(libbrain::bfop)0,_(libbrain::bfop)2,_(libbrain::bfop)5,_(libbrain::bfop)3,_(libbrain::bfop)7,_(libbrain::bfop)1,_(libbrain::bfop)2,_(libbrain::bfop)1,_(libbrain::bfop)3,_(libbrain::bfop)8,_(libbrain::bfop)2,_(libbrain::bfop)8,_(libbrain::bfop)9>
            ::exec(data,0,(FILE *)__stream,(FILE *)input);
  }
  operator_delete__(data);
  return iVar2;
}

Assistant:

int main() {
    auto* data = BRAIN_ALLOC_TAPE(10000);

    // the cat program: reads from the input until such a time as it reads a 'tab' character
    BRAIN_PROGRAM stdin_cat = BRAIN_COMPILE(+++++++++>,<[->-<]>[+++++++++.<+++++++++>,<[->-<]>]);

    int status_code = stdin_cat.exec(data, 0);

    delete[] data;

    return status_code;
}